

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
 __thiscall
wabt::MakeUnique<(anonymous_namespace)::TestObject,(anonymous_namespace)::TestObject>
          (wabt *this,TestObject *args)

{
  TestObject *this_00;
  TestObject *args_local;
  
  this_00 = (TestObject *)operator_new(0x20);
  anon_unknown.dwarf_4eaaf::TestObject::TestObject(this_00,args);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,std::default_delete<(anonymous_namespace)::TestObject>>
  ::unique_ptr<std::default_delete<(anonymous_namespace)::TestObject>,void>
            ((unique_ptr<(anonymous_namespace)::TestObject,std::default_delete<(anonymous_namespace)::TestObject>>
              *)this,this_00);
  return (__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}